

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void mg_set_user_connection_data(mg_connection *const_conn,void *data)

{
  mg_connection *conn;
  void *data_local;
  mg_connection *const_conn_local;
  
  if (const_conn != (mg_connection *)0x0) {
    (const_conn->request_info).conn_data = data;
  }
  return;
}

Assistant:

CIVETWEB_API void
mg_set_user_connection_data(const struct mg_connection *const_conn, void *data)
{
	if (const_conn != NULL) {
		/* Const cast, since "const struct mg_connection *" does not mean
		 * the connection object is not modified. Here "const" is used,
		 * to indicate mg_read/mg_write/mg_send/.. must not be called. */
		struct mg_connection *conn = (struct mg_connection *)const_conn;
		conn->request_info.conn_data = data;
	}
}